

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_builder.h
# Opt level: O2

bool __thiscall Clasp::SatBuilder::doStartProgram(SatBuilder *this)

{
  bool bVar1;
  
  this->vars_ = (((this->super_ProgramBuilder).ctx_)->varInfo_).ebo_.size - 1;
  this->pos_ = 0;
  (this->assume_).ebo_.size = 0;
  bVar1 = markAssigned(this);
  return bVar1;
}

Assistant:

SharedContext*   ctx()    const { return ctx_; }